

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O3

void compact_int8_suite::fail_array8_int8_missing_one(void)

{
  value_type input [2];
  decoder decoder;
  uchar local_42 [2];
  undefined4 local_40;
  value local_3c;
  decoder local_38;
  
  local_38.input._M_str = local_42;
  local_42[0] = 0xa8;
  local_42[1] = '\x01';
  local_38.input._M_len = 2;
  local_38.current.view._M_len = 0;
  local_38.current.view._M_str = (uchar *)0x0;
  local_38.current.code = end;
  trial::protocol::bintoken::detail::decoder::next(&local_38);
  local_3c = local_38.current.code;
  local_40 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::bintoken::token::code::value,trial::protocol::bintoken::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/bintoken/decoder_suite.cpp"
             ,0x59a,"void compact_int8_suite::fail_array8_int8_missing_one()",&local_3c,&local_40);
  return;
}

Assistant:

void fail_array8_int8_missing_one()
{
    const value_type input[] = { token::code::array8_int8, 0x01 };
    format::detail::decoder decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}